

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

RegistryEntry *
bhf::ads::RegistryEntry::Create
          (RegistryEntry *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,nRegHive hive,
          uint32_t regFlag)

{
  pointer __string;
  size_t i;
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  runtime_error *this;
  byte bVar4;
  ulong uVar5;
  size_t dataLen;
  uint32_t type;
  size_t __maxlen;
  
  __string = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  __maxlen = (long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)__string;
  sVar1 = strnlen((char *)__string,__maxlen);
  uVar2 = sVar1 + 1;
  uVar5 = __maxlen - uVar2;
  if (__maxlen < uVar2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"missing string terminator for value or key.");
  }
  else if (uVar5 == 0) {
    if (regFlag == 0) {
      type = 0;
      dataLen = 0;
LAB_00129310:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&__return_storage_ptr__->buffer,buffer);
      __return_storage_ptr__->hive = hive;
      __return_storage_ptr__->keyLen = __maxlen;
      __return_storage_ptr__->type = type;
      __return_storage_ptr__->dataLen = dataLen;
      return __return_storage_ptr__;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Got registry key from network, but we expected somthing else.");
  }
  else if (regFlag == 0xc0000000) {
    if (3 < uVar5) {
      bVar4 = 0;
      type = 0;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        type = type + ((uint)__string[lVar3 + uVar2] << (bVar4 & 0x1f));
        bVar4 = bVar4 + 8;
      }
      dataLen = uVar5 - 4;
      VerifyDataLen(type,dataLen,0xffffffffffffffff);
      __maxlen = 0;
      goto LAB_00129310;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"not enough bytes for type left");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Got registry value from network, but we expected something else.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RegistryEntry RegistryEntry::Create(const std::vector<uint8_t>&& buffer, const nRegHive hive, const uint32_t regFlag)
{
    const auto stringLen = 1 + strnlen(reinterpret_cast<const char*>(buffer.data()), buffer.size());
    if (buffer.size() < stringLen) {
        throw std::runtime_error("missing string terminator for value or key.");
    }

    if (buffer.size() == stringLen) {
        // Registry key has only the name as a NULL terminated string
        if (regFlag != REGFLAG_ENUMKEYS) {
            throw std::runtime_error("Got registry key from network, but we expected somthing else.");
        }
        return RegistryEntry{ buffer, hive, stringLen, 0, 0 };
    }
    if (regFlag != REGFLAG_ENUMVALUE_VTD) {
        throw std::runtime_error("Got registry value from network, but we expected something else.");
    }

    auto bytesLeft = buffer.size() - stringLen;
    uint32_t type = 0;
    if (bytesLeft < sizeof(type)) {
        throw std::runtime_error("not enough bytes for type left");
    }

    for (size_t i = 0; i < sizeof(type); i++) {
        type += buffer[stringLen + i] << i * 8;
        --bytesLeft;
    }
    VerifyDataLen(type, bytesLeft, std::numeric_limits<size_t>::max());
    return RegistryEntry { buffer, hive, 0, type, bytesLeft };
}